

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::XmlReporter::StartSection(XmlReporter *this,string *sectionName,string *description)

{
  int iVar1;
  XmlWriter *pXVar2;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + 1;
  if (0 < iVar1) {
    std::__cxx11::string::string((string *)&local_40,"Section",&local_81);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_40);
    std::__cxx11::string::string((string *)&local_60,"name",&local_82);
    pXVar2 = XmlWriter::writeAttribute(pXVar2,&local_60,sectionName);
    std::__cxx11::string::string((string *)&local_80,"description",&local_83);
    XmlWriter::writeAttribute(pXVar2,&local_80,description);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

virtual void StartSection( const std::string& sectionName, const std::string& description ) {
            if( m_sectionDepth++ > 0 ) {
                m_xml.startElement( "Section" )
                    .writeAttribute( "name", sectionName )
                    .writeAttribute( "description", description );
            }
        }